

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

void arkStep_Free(ARKodeMem ark_mem)

{
  long in_RDI;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw;
  sunindextype Bliw;
  int j;
  N_Vector *v;
  ARKodeMem in_stack_ffffffffffffffe0;
  long local_18;
  int local_c;
  long local_8;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x88) != 0)) {
    v = *(N_Vector **)(in_RDI + 0x88);
    local_8 = in_RDI;
    if (v[0xe] != (N_Vector)0x0) {
      ARKodeButcherTable_Space
                ((ARKodeButcherTable)v[0xe],&local_18,(sunindextype *)&stack0xffffffffffffffe0);
      ARKodeButcherTable_Free((ARKodeButcherTable)in_stack_ffffffffffffffe0);
      v[0xe] = (N_Vector)0x0;
      *(long *)(local_8 + 0x370) = *(long *)(local_8 + 0x370) - local_18;
      *(long *)(local_8 + 0x368) = *(long *)(local_8 + 0x368) - (long)in_stack_ffffffffffffffe0;
    }
    if (v[0xf] != (N_Vector)0x0) {
      ARKodeButcherTable_Space
                ((ARKodeButcherTable)v[0xf],&local_18,(sunindextype *)&stack0xffffffffffffffe0);
      ARKodeButcherTable_Free((ARKodeButcherTable)in_stack_ffffffffffffffe0);
      v[0xf] = (N_Vector)0x0;
      *(long *)(local_8 + 0x370) = *(long *)(local_8 + 0x370) - local_18;
      *(long *)(local_8 + 0x368) = *(long *)(local_8 + 0x368) - (long)in_stack_ffffffffffffffe0;
    }
    if ((v[0x11] != (N_Vector)0x0) && (*(int *)(v + 0x12) != 0)) {
      SUNNonlinSolFree(v[0x11]);
      *(undefined4 *)(v + 0x12) = 0;
    }
    v[0x11] = (N_Vector)0x0;
    if (v[0x27] != (N_Vector)0x0) {
      (*(code *)v[0x27])(local_8);
      v[0x28] = (N_Vector)0x0;
    }
    if (v[0x2e] != (N_Vector)0x0) {
      (*(code *)v[0x2e])(local_8);
      v[0x2f] = (N_Vector)0x0;
    }
    if (v[9] != (N_Vector)0x0) {
      arkFreeVec(in_stack_ffffffffffffffe0,v);
      v[9] = (N_Vector)0x0;
    }
    if (v[10] != (N_Vector)0x0) {
      arkFreeVec(in_stack_ffffffffffffffe0,v);
      v[10] = (N_Vector)0x0;
    }
    if (v[0xb] != (N_Vector)0x0) {
      arkFreeVec(in_stack_ffffffffffffffe0,v);
      v[0xb] = (N_Vector)0x0;
    }
    if (v[6] != (N_Vector)0x0) {
      for (local_c = 0; local_c < *(int *)((long)v + 0x6c); local_c = local_c + 1) {
        arkFreeVec(in_stack_ffffffffffffffe0,v);
      }
      free(v[6]);
      v[6] = (N_Vector)0x0;
      *(long *)(local_8 + 0x370) = *(long *)(local_8 + 0x370) - (long)*(int *)((long)v + 0x6c);
    }
    if (v[7] != (N_Vector)0x0) {
      for (local_c = 0; local_c < *(int *)((long)v + 0x6c); local_c = local_c + 1) {
        arkFreeVec(in_stack_ffffffffffffffe0,v);
      }
      free(v[7]);
      v[7] = (N_Vector)0x0;
      *(long *)(local_8 + 0x370) = *(long *)(local_8 + 0x370) - (long)*(int *)((long)v + 0x6c);
    }
    if (v[8] != (N_Vector)0x0) {
      for (local_c = 0; local_c < *(int *)((long)v + 0x6c); local_c = local_c + 1) {
        arkFreeVec(in_stack_ffffffffffffffe0,v);
      }
      free(v[8]);
      v[8] = (N_Vector)0x0;
      *(long *)(local_8 + 0x370) = *(long *)(local_8 + 0x370) - (long)*(int *)((long)v + 0x6c);
    }
    if (v[0x36] != (N_Vector)0x0) {
      free(v[0x36]);
      v[0x36] = (N_Vector)0x0;
      *(long *)(local_8 + 0x368) = *(long *)(local_8 + 0x368) - (long)*(int *)(v + 0x38);
    }
    if (v[0x37] != (N_Vector)0x0) {
      free(v[0x37]);
      v[0x37] = (N_Vector)0x0;
      *(long *)(local_8 + 0x370) = *(long *)(local_8 + 0x370) - (long)*(int *)(v + 0x38);
    }
    *(undefined4 *)(v + 0x38) = 0;
    if (v[0x3e] != (N_Vector)0x0) {
      free(v[0x3e]);
      v[0x3e] = (N_Vector)0x0;
      *(long *)(local_8 + 0x368) = *(long *)(local_8 + 0x368) - (long)*(int *)((long)v + 0x6c);
    }
    if (v[0x3f] != (N_Vector)0x0) {
      free(v[0x3f]);
      v[0x3f] = (N_Vector)0x0;
      *(long *)(local_8 + 0x368) = *(long *)(local_8 + 0x368) - (long)*(int *)((long)v + 0x6c);
    }
    free(*(void **)(local_8 + 0x88));
    *(undefined8 *)(local_8 + 0x88) = 0;
  }
  return;
}

Assistant:

void arkStep_Free(ARKodeMem ark_mem)
{
  int j;
  sunindextype Bliw, Blrw;
  ARKodeARKStepMem step_mem;

  /* nothing to do if ark_mem is already NULL */
  if (ark_mem == NULL) { return; }

  /* conditional frees on non-NULL ARKStep module */
  if (ark_mem->step_mem != NULL)
  {
    step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

    /* free the Butcher tables */
    if (step_mem->Be != NULL)
    {
      ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
      ARKodeButcherTable_Free(step_mem->Be);
      step_mem->Be = NULL;
      ark_mem->liw -= Bliw;
      ark_mem->lrw -= Blrw;
    }
    if (step_mem->Bi != NULL)
    {
      ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
      ARKodeButcherTable_Free(step_mem->Bi);
      step_mem->Bi = NULL;
      ark_mem->liw -= Bliw;
      ark_mem->lrw -= Blrw;
    }

    /* free the nonlinear solver memory (if applicable) */
    if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
    {
      SUNNonlinSolFree(step_mem->NLS);
      step_mem->ownNLS = SUNFALSE;
    }
    step_mem->NLS = NULL;

    /* free the linear solver memory */
    if (step_mem->lfree != NULL)
    {
      step_mem->lfree((void*)ark_mem);
      step_mem->lmem = NULL;
    }

    /* free the mass matrix solver memory */
    if (step_mem->mfree != NULL)
    {
      step_mem->mfree((void*)ark_mem);
      step_mem->mass_mem = NULL;
    }

    /* free the sdata, zpred and zcor vectors */
    if (step_mem->sdata != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->sdata);
      step_mem->sdata = NULL;
    }
    if (step_mem->zpred != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->zpred);
      step_mem->zpred = NULL;
    }
    if (step_mem->zcor != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->zcor);
      step_mem->zcor = NULL;
    }

    /* free the RHS vectors */
    if (step_mem->Fe != NULL)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        arkFreeVec(ark_mem, &step_mem->Fe[j]);
      }
      free(step_mem->Fe);
      step_mem->Fe = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    if (step_mem->Fi != NULL)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        arkFreeVec(ark_mem, &step_mem->Fi[j]);
      }
      free(step_mem->Fi);
      step_mem->Fi = NULL;
      ark_mem->liw -= step_mem->stages;
    }

    /* free stage vectors */
    if (step_mem->z != NULL)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        arkFreeVec(ark_mem, &step_mem->z[j]);
      }
      free(step_mem->z);
      step_mem->z = NULL;
      ark_mem->liw -= step_mem->stages;
    }

    /* free the reusable arrays for fused vector interface */
    if (step_mem->cvals != NULL)
    {
      free(step_mem->cvals);
      step_mem->cvals = NULL;
      ark_mem->lrw -= step_mem->nfusedopvecs;
    }
    if (step_mem->Xvecs != NULL)
    {
      free(step_mem->Xvecs);
      step_mem->Xvecs = NULL;
      ark_mem->liw -= step_mem->nfusedopvecs;
    }
    step_mem->nfusedopvecs = 0;

    /* free work arrays for MRI forcing */
    if (step_mem->stage_times)
    {
      free(step_mem->stage_times);
      step_mem->stage_times = NULL;
      ark_mem->lrw -= step_mem->stages;
    }

    if (step_mem->stage_coefs)
    {
      free(step_mem->stage_coefs);
      step_mem->stage_coefs = NULL;
      ark_mem->lrw -= step_mem->stages;
    }

    /* free the time stepper module itself */
    free(ark_mem->step_mem);
    ark_mem->step_mem = NULL;
  }
}